

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFile(DescriptorBuilder *this,FileDescriptorProto *proto)

{
  size_t __n;
  DescriptorPool *pDVar1;
  pointer pcVar2;
  Message *pMVar3;
  MessageLite *this_00;
  pointer pOVar4;
  undefined8 uVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  LogMessage *pLVar9;
  FileDescriptor *pFVar10;
  pointer pbVar11;
  SourceCodeInfo *this_01;
  FileDescriptorTables *pFVar12;
  string *psVar13;
  void *pvVar14;
  long *plVar15;
  DescriptorPool *pDVar16;
  pointer pOVar17;
  undefined4 extraout_var;
  FieldDescriptor *pFVar18;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  string *psVar19;
  ulong *puVar20;
  Tables *pTVar21;
  void *extraout_RDX;
  void *extraout_RDX_00;
  int iVar22;
  long lVar23;
  SourceCodeInfo *from;
  FileOptions *orig_options;
  long lVar24;
  pointer pOVar25;
  ulong uVar26;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar27;
  bool bVar28;
  const_iterator cVar29;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar30;
  size_type __dnew;
  string buf;
  FileDescriptorProto existing_proto;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seen_dependencies;
  LogFinisher local_1b9;
  Tables *local_1b8;
  undefined1 local_1b0 [16];
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  pointer local_138;
  undefined1 local_130 [24];
  DynamicMessageFactory local_118 [4];
  undefined1 local_60 [32];
  _Base_ptr local_40;
  size_t local_38;
  
  std::__cxx11::string::_M_assign((string *)&this->filename_);
  pTVar21 = this->tables_;
  local_130._0_8_ = (this->filename_)._M_dataplus._M_p;
  cVar29 = std::tr1::
           _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
           ::find((_Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                   *)&pTVar21->files_by_name_,(key_type *)local_130);
  if ((cVar29.
       super__Hashtable_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_false>
       ._M_cur_node !=
       (pTVar21->files_by_name_).
       super_unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>_>
       .
       super___unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_false>
       .
       super__Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
       ._M_buckets
       [(pTVar21->files_by_name_).
        super_unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>_>
        .
        super___unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_false>
        .
        super__Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
        ._M_bucket_count]) &&
     (pFVar10 = ((cVar29.
                  super__Hashtable_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_false>
                 ._M_cur_node)->_M_v).second, pFVar10 != (FileDescriptor *)0x0)) {
    FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_130);
    FileDescriptor::CopyTo(pFVar10,(FileDescriptorProto *)local_130);
    MessageLite::SerializeAsString_abi_cxx11_((string *)local_1b0,(MessageLite *)local_130);
    MessageLite::SerializeAsString_abi_cxx11_((string *)local_60,(MessageLite *)proto);
    uVar5 = local_60._0_8_;
    if ((pointer)local_1b0._8_8_ == (pointer)CONCAT44(local_60._12_4_,local_60._8_4_)) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._8_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        bVar28 = true;
      }
      else {
        iVar7 = bcmp((void *)local_1b0._0_8_,(void *)local_60._0_8_,local_1b0._8_8_);
        bVar28 = iVar7 == 0;
      }
    }
    else {
      bVar28 = false;
    }
    if ((undefined1 *)uVar5 != local_60 + 0x10) {
      operator_delete((void *)uVar5,local_60._16_8_ + 1);
    }
    if ((string *)local_1b0._0_8_ != &local_1a0) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0._M_dataplus._M_p + 1));
    }
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_130);
    if (bVar28) {
      return pFVar10;
    }
  }
  local_1b8 = this->tables_;
  pbVar11 = (local_1b8->pending_files_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar23 = (long)(local_1b8->pending_files_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11;
  if (lVar23 != 0) {
    lVar23 = lVar23 >> 5;
    psVar13 = proto->name_;
    __n = psVar13->_M_string_length;
    lVar24 = 8;
    uVar26 = 0;
LAB_001d0d18:
    if ((*(size_t *)((long)&(pbVar11->_M_dataplus)._M_p + lVar24) != __n) ||
       ((__n != 0 &&
        (iVar7 = bcmp(*(void **)((long)pbVar11 + lVar24 + -8),(psVar13->_M_dataplus)._M_p,__n),
        iVar7 != 0)))) goto LAB_001d0d3f;
    local_1b0._0_8_ = (string *)0x21;
    local_130._0_8_ = local_130 + 0x10;
    local_130._0_8_ = std::__cxx11::string::_M_create((ulong *)local_130,(ulong)local_1b0);
    local_130._16_8_ = local_1b0._0_8_;
    *(undefined8 *)(local_130._0_8_ + 0x10) = 0x7374726f706d6920;
    *(undefined8 *)(local_130._0_8_ + 0x18) = 0x3a666c6573746920;
    *(undefined8 *)local_130._0_8_ = 0x63657220656c6946;
    *(undefined8 *)(local_130._0_8_ + 8) = 0x796c657669737275;
    *(char *)(local_130._0_8_ + 0x20) = ' ';
    local_130._8_8_ = local_1b0._0_8_;
    *(char *)(local_130._0_8_ + local_1b0._0_8_) = '\0';
    pbVar11 = (this->tables_->pending_files_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((uVar26 & 0xffffffff) <
        (ulong)((long)(this->tables_->pending_files_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5)) {
      do {
        std::__cxx11::string::_M_append(local_130,*(ulong *)((long)pbVar11 + lVar24 + -8));
        std::__cxx11::string::append(local_130);
        uVar26 = uVar26 + 1;
        pbVar11 = (this->tables_->pending_files_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar24 = lVar24 + 0x20;
      } while (uVar26 < (ulong)((long)(this->tables_->pending_files_).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >>
                               5));
    }
    std::__cxx11::string::_M_append(local_130,(ulong)(proto->name_->_M_dataplus)._M_p);
    AddError(this,proto->name_,&proto->super_Message,OTHER,(string *)local_130);
    if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
      operator_delete((void *)local_130._0_8_,(ulong)(local_130._16_8_ + 1));
    }
    goto LAB_001d18fb;
  }
LAB_001d0d4b:
  pTVar21 = local_1b8;
  if (this->pool_->fallback_database_ != (DescriptorDatabase *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_1b8->pending_files_,proto->name_);
    if (0 < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_) {
      lVar23 = 0;
      do {
        pTVar21 = this->tables_;
        local_130._0_8_ = *(proto->dependency_).super_RepeatedPtrFieldBase.elements_[lVar23];
        cVar29 = std::tr1::
                 _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                 ::find((_Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                         *)&pTVar21->files_by_name_,(key_type *)local_130);
        if ((cVar29.
             super__Hashtable_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_false>
             ._M_cur_node ==
             (pTVar21->files_by_name_).
             super_unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>_>
             .
             super___unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_false>
             .
             super__Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
             ._M_buckets
             [(pTVar21->files_by_name_).
              super_unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>_>
              .
              super___unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_false>
              .
              super__Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
              ._M_bucket_count]) ||
           (((cVar29.
              super__Hashtable_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_false>
             ._M_cur_node)->_M_v).second == (FileDescriptor *)0x0)) {
          pDVar16 = this->pool_;
          pDVar1 = pDVar16->underlay_;
          if (pDVar1 != (DescriptorPool *)0x0) {
            if ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= lVar23) {
              internal::LogMessage::LogMessage
                        ((LogMessage *)local_130,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                         ,0x338);
              pLVar9 = internal::LogMessage::operator<<
                                 ((LogMessage *)local_130,"CHECK failed: (index) < (size()): ");
              internal::LogFinisher::operator=((LogFinisher *)local_1b0,pLVar9);
              internal::LogMessage::~LogMessage((LogMessage *)local_130);
            }
            pFVar10 = DescriptorPool::FindFileByName
                                (pDVar1,(string *)
                                        (proto->dependency_).super_RepeatedPtrFieldBase.elements_
                                        [lVar23]);
            if (pFVar10 != (FileDescriptor *)0x0) goto LAB_001d0eb2;
            pDVar16 = this->pool_;
          }
          if ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= lVar23) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_130,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                       ,0x338);
            pLVar9 = internal::LogMessage::operator<<
                               ((LogMessage *)local_130,"CHECK failed: (index) < (size()): ");
            internal::LogFinisher::operator=((LogFinisher *)local_1b0,pLVar9);
            internal::LogMessage::~LogMessage((LogMessage *)local_130);
          }
          DescriptorPool::TryFindFileInFallbackDatabase
                    (pDVar16,(string *)
                             (proto->dependency_).super_RepeatedPtrFieldBase.elements_[lVar23]);
        }
LAB_001d0eb2:
        lVar23 = lVar23 + 1;
      } while (lVar23 < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_);
    }
    pTVar21 = this->tables_;
    pbVar11 = (pTVar21->pending_files_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    (pTVar21->pending_files_).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar11 + -1;
    pcVar2 = pbVar11[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &pbVar11[-1].field_2) {
      operator_delete(pcVar2,pbVar11[-1].field_2._M_allocated_capacity + 1);
      pTVar21 = this->tables_;
    }
  }
  DescriptorPool::Tables::AddCheckpoint(pTVar21);
  pFVar10 = (FileDescriptor *)DescriptorPool::Tables::AllocateBytes(this->tables_,0xa0);
  this->file_ = pFVar10;
  if ((proto->_has_bits_[0] & 0x400) == 0) {
    this_01 = SourceCodeInfo::default_instance();
  }
  else {
    this_01 = DescriptorPool::Tables::AllocateMessage<google::protobuf::SourceCodeInfo>
                        (this->tables_,(SourceCodeInfo *)0x0);
    from = proto->source_code_info_;
    if (from == (SourceCodeInfo *)0x0) {
      from = *(SourceCodeInfo **)(FileDescriptorProto::default_instance_ + 0xc0);
    }
    SourceCodeInfo::CopyFrom(this_01,from);
  }
  *(SourceCodeInfo **)(pFVar10 + 0x98) = this_01;
  pFVar12 = DescriptorPool::Tables::AllocateFileTables(this->tables_);
  this->file_tables_ = pFVar12;
  *(FileDescriptorTables **)(this->file_ + 0x90) = pFVar12;
  if ((proto->_has_bits_[0] & 1) == 0) {
    local_130._8_8_ = (string *)0x0;
    local_130._16_8_ = local_130._16_8_ & 0xffffffffffffff00;
    local_60._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x28;
    local_1b0._0_8_ = &local_1a0;
    local_130._0_8_ = local_130 + 0x10;
    local_1b0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1b0,(ulong)local_60);
    local_1a0._M_dataplus._M_p = (pointer)local_60._0_8_;
    (((string *)local_1b0._0_8_)->field_2)._M_allocated_capacity = 0x7263736544656c69;
    builtin_strncpy((char *)((long)&((string *)local_1b0._0_8_)->field_2 + 8),"iptorPro",8);
    (((string *)local_1b0._0_8_)->_M_dataplus)._M_p = (pointer)0x20676e697373694d;
    ((string *)local_1b0._0_8_)->_M_string_length = 0x46203a646c656966;
    (((string *)(local_1b0._0_8_ + 0x20))->_M_dataplus)._M_p = (pointer)0x2e656d616e2e6f74;
    local_1b0._8_8_ = local_60._0_8_;
    *(char *)((long)&(((string *)local_1b0._0_8_)->_M_dataplus)._M_p + local_60._0_8_) = '\0';
    AddError(this,(string *)local_130,&proto->super_Message,OTHER,(string *)local_1b0);
    if ((string *)local_1b0._0_8_ != &local_1a0) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0._M_dataplus._M_p + 1));
    }
    if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
      operator_delete((void *)local_130._0_8_,(ulong)(local_130._16_8_ + 1));
    }
  }
  psVar13 = DescriptorPool::Tables::AllocateString(this->tables_,proto->name_);
  *(string **)pFVar10 = psVar13;
  if ((proto->_has_bits_[0] & 2) == 0) {
    local_130._8_8_ = (string *)0x0;
    local_130._16_8_ = local_130._16_8_ & 0xffffffffffffff00;
    local_130._0_8_ = local_130 + 0x10;
    psVar13 = DescriptorPool::Tables::AllocateString(this->tables_,(string *)local_130);
    *(string **)(pFVar10 + 8) = psVar13;
    if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
      operator_delete((void *)local_130._0_8_,(ulong)(local_130._16_8_ + 1));
    }
  }
  else {
    psVar13 = DescriptorPool::Tables::AllocateString(this->tables_,proto->package_);
    *(string **)(pFVar10 + 8) = psVar13;
  }
  *(DescriptorPool **)(pFVar10 + 0x10) = this->pool_;
  bVar28 = DescriptorPool::Tables::AddFile(this->tables_,pFVar10);
  if (bVar28) {
    if ((*(string **)(pFVar10 + 8))->_M_string_length != 0) {
      AddPackage(this,*(string **)(pFVar10 + 8),&proto->super_Message,pFVar10);
    }
    local_60._24_8_ = local_60 + 8;
    local_60._8_4_ = _S_red;
    local_60._16_8_ = 0;
    local_38 = 0;
    iVar7 = (proto->dependency_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)(pFVar10 + 0x18) = iVar7;
    local_40 = (_Base_ptr)local_60._24_8_;
    pvVar14 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar7 << 3);
    *(void **)(pFVar10 + 0x20) = pvVar14;
    local_1b8 = (Tables *)pFVar10;
    if (0 < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_) {
      paVar27 = &local_178.field_2;
      lVar23 = 0;
      do {
        pVar30 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)local_60,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (proto->dependency_).super_RepeatedPtrFieldBase.elements_[lVar23]);
        if (((undefined1  [16])pVar30 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          psVar13 = proto->name_;
          if ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= lVar23) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_130,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                       ,0x338);
            pLVar9 = internal::LogMessage::operator<<
                               ((LogMessage *)local_130,"CHECK failed: (index) < (size()): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_158,pLVar9);
            internal::LogMessage::~LogMessage((LogMessage *)local_130);
          }
          std::operator+(&local_178,"Import \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (proto->dependency_).super_RepeatedPtrFieldBase.elements_[lVar23]);
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_178);
          local_1b0._0_8_ = &local_1a0;
          psVar19 = (string *)(plVar15 + 2);
          if ((string *)*plVar15 == psVar19) {
            local_1a0._M_dataplus._M_p = (psVar19->_M_dataplus)._M_p;
            local_1a0._M_string_length = plVar15[3];
          }
          else {
            local_1a0._M_dataplus._M_p = (psVar19->_M_dataplus)._M_p;
            local_1b0._0_8_ = (string *)*plVar15;
          }
          local_1b0._8_8_ = plVar15[1];
          *plVar15 = (long)psVar19;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          AddError(this,psVar13,&proto->super_Message,OTHER,(string *)local_1b0);
          if ((string *)local_1b0._0_8_ != &local_1a0) {
            operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0._M_dataplus._M_p + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != paVar27) {
            operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
          }
        }
        pTVar21 = this->tables_;
        if ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= lVar23) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_130,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                     ,0x338);
          pLVar9 = internal::LogMessage::operator<<
                             ((LogMessage *)local_130,"CHECK failed: (index) < (size()): ");
          internal::LogFinisher::operator=((LogFinisher *)local_1b0,pLVar9);
          internal::LogMessage::~LogMessage((LogMessage *)local_130);
        }
        local_130._0_8_ = *(proto->dependency_).super_RepeatedPtrFieldBase.elements_[lVar23];
        cVar29 = std::tr1::
                 _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                 ::find((_Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                         *)&pTVar21->files_by_name_,(key_type *)local_130);
        if ((cVar29.
             super__Hashtable_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_false>
             ._M_cur_node ==
             (pTVar21->files_by_name_).
             super_unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>_>
             .
             super___unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_false>
             .
             super__Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
             ._M_buckets
             [(pTVar21->files_by_name_).
              super_unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>_>
              .
              super___unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_false>
              .
              super__Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
              ._M_bucket_count]) ||
           (pFVar10 = ((cVar29.
                        super__Hashtable_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_false>
                       ._M_cur_node)->_M_v).second, pFVar10 == (FileDescriptor *)0x0)) {
          pDVar16 = this->pool_;
          pDVar1 = pDVar16->underlay_;
          if (pDVar1 != (DescriptorPool *)0x0) {
            if ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= lVar23) {
              internal::LogMessage::LogMessage
                        ((LogMessage *)local_130,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                         ,0x338);
              pLVar9 = internal::LogMessage::operator<<
                                 ((LogMessage *)local_130,"CHECK failed: (index) < (size()): ");
              internal::LogFinisher::operator=((LogFinisher *)local_1b0,pLVar9);
              internal::LogMessage::~LogMessage((LogMessage *)local_130);
            }
            pFVar10 = DescriptorPool::FindFileByName
                                (pDVar1,(string *)
                                        (proto->dependency_).super_RepeatedPtrFieldBase.elements_
                                        [lVar23]);
            if (pFVar10 != (FileDescriptor *)0x0) goto LAB_001d172b;
            pDVar16 = this->pool_;
          }
          if (pDVar16->allow_unknown_ == true) {
            if ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= lVar23) {
              internal::LogMessage::LogMessage
                        ((LogMessage *)local_130,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                         ,0x338);
              pLVar9 = internal::LogMessage::operator<<
                                 ((LogMessage *)local_130,"CHECK failed: (index) < (size()): ");
              internal::LogFinisher::operator=((LogFinisher *)local_1b0,pLVar9);
              internal::LogMessage::~LogMessage((LogMessage *)local_130);
            }
            pFVar10 = NewPlaceholderFile(this,(string *)
                                              (proto->dependency_).super_RepeatedPtrFieldBase.
                                              elements_[lVar23]);
          }
          else {
            local_1b0._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_1a0._M_dataplus._M_p = local_1a0._M_dataplus._M_p & 0xffffffffffffff00;
            local_1b0._0_8_ = &local_1a0;
            if (pDVar16->fallback_database_ == (DescriptorDatabase *)0x0) {
              if ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= lVar23) {
                internal::LogMessage::LogMessage
                          ((LogMessage *)local_130,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                           ,0x338);
                pLVar9 = internal::LogMessage::operator<<
                                   ((LogMessage *)local_130,"CHECK failed: (index) < (size()): ");
                internal::LogFinisher::operator=(&local_1b9,pLVar9);
                internal::LogMessage::~LogMessage((LogMessage *)local_130);
              }
              std::operator+(&local_158,"Import \"",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (proto->dependency_).super_RepeatedPtrFieldBase.elements_[lVar23]);
              plVar15 = (long *)std::__cxx11::string::append((char *)&local_158);
            }
            else {
              if ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= lVar23) {
                internal::LogMessage::LogMessage
                          ((LogMessage *)local_130,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                           ,0x338);
                pLVar9 = internal::LogMessage::operator<<
                                   ((LogMessage *)local_130,"CHECK failed: (index) < (size()): ");
                internal::LogFinisher::operator=(&local_1b9,pLVar9);
                internal::LogMessage::~LogMessage((LogMessage *)local_130);
              }
              std::operator+(&local_158,"Import \"",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (proto->dependency_).super_RepeatedPtrFieldBase.elements_[lVar23]);
              plVar15 = (long *)std::__cxx11::string::append((char *)&local_158);
            }
            puVar20 = (ulong *)(plVar15 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar15 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar20) {
              local_178.field_2._M_allocated_capacity = *puVar20;
              local_178.field_2._8_8_ = plVar15[3];
              local_178._M_dataplus._M_p = (pointer)paVar27;
            }
            else {
              local_178.field_2._M_allocated_capacity = *puVar20;
              local_178._M_dataplus._M_p = (pointer)*plVar15;
            }
            local_178._M_string_length = plVar15[1];
            *plVar15 = (long)puVar20;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            std::__cxx11::string::operator=((string *)local_1b0,(string *)&local_178);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != paVar27) {
              operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
            AddError(this,proto->name_,&proto->super_Message,OTHER,(string *)local_1b0);
            if ((string *)local_1b0._0_8_ != &local_1a0) {
              operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0._M_dataplus._M_p + 1));
            }
            pFVar10 = (FileDescriptor *)0x0;
          }
        }
LAB_001d172b:
        *(FileDescriptor **)(*(long *)((long)local_1b8 + 0x20) + lVar23 * 8) = pFVar10;
        lVar23 = lVar23 + 1;
      } while (lVar23 < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_);
    }
    pvVar14 = DescriptorPool::Tables::AllocateBytes
                        (this->tables_,(proto->public_dependency_).current_size_ << 2);
    *(void **)((long)local_1b8 + 0x30) = pvVar14;
    if ((proto->public_dependency_).current_size_ < 1) {
      iVar7 = 0;
    }
    else {
      lVar23 = 0;
      iVar7 = 0;
      do {
        iVar22 = (proto->public_dependency_).elements_[lVar23];
        if ((iVar22 < 0) ||
           ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= iVar22)) {
          psVar13 = proto->name_;
          local_1b0._0_8_ = (string *)0x20;
          local_130._0_8_ = local_130 + 0x10;
          local_130._0_8_ = std::__cxx11::string::_M_create((ulong *)local_130,(ulong)local_1b0);
          local_130._16_8_ = local_1b0._0_8_;
          *(undefined8 *)(local_130._0_8_ + 0x10) = 0x636e65646e657065;
          *(undefined8 *)(local_130._0_8_ + 0x18) = 0x2e7865646e692079;
          *(undefined8 *)local_130._0_8_ = 0x2064696c61766e49;
          *(undefined8 *)(local_130._0_8_ + 8) = 0x642063696c627570;
          local_130._8_8_ = local_1b0._0_8_;
          *(char *)(local_130._0_8_ + local_1b0._0_8_) = '\0';
          AddError(this,psVar13,&proto->super_Message,OTHER,(string *)local_130);
          if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
            operator_delete((void *)local_130._0_8_,(ulong)(local_130._16_8_ + 1));
          }
        }
        else {
          lVar24 = (long)iVar7;
          iVar7 = iVar7 + 1;
          *(int *)(*(long *)((long)local_1b8 + 0x30) + lVar24 * 4) = iVar22;
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 < (proto->public_dependency_).current_size_);
    }
    pTVar21 = local_1b8;
    *(int *)((long)local_1b8 + 0x28) = iVar7;
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::clear(&(this->dependencies_)._M_t);
    if (0 < *(int *)((long)pTVar21 + 0x18)) {
      lVar23 = 0;
      do {
        RecordPublicDependencies
                  (this,*(FileDescriptor **)(*(long *)((long)pTVar21 + 0x20) + lVar23 * 8));
        lVar23 = lVar23 + 1;
      } while (lVar23 < *(int *)((long)pTVar21 + 0x18));
    }
    pvVar14 = DescriptorPool::Tables::AllocateBytes
                        (this->tables_,(proto->weak_dependency_).current_size_ << 2);
    *(void **)((long)pTVar21 + 0x40) = pvVar14;
    if ((proto->weak_dependency_).current_size_ < 1) {
      iVar7 = 0;
    }
    else {
      lVar23 = 0;
      iVar7 = 0;
      do {
        iVar22 = (proto->weak_dependency_).elements_[lVar23];
        if ((iVar22 < 0) ||
           ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= iVar22)) {
          psVar13 = proto->name_;
          local_1b0._0_8_ = (string *)0x1e;
          local_130._0_8_ = local_130 + 0x10;
          local_130._0_8_ = std::__cxx11::string::_M_create((ulong *)local_130,(ulong)local_1b0);
          local_130._16_8_ = local_1b0._0_8_;
          builtin_strncpy((char *)(local_130._0_8_ + 0xe),"ependenc",8);
          builtin_strncpy((char *)(local_130._0_8_ + 0x16),"y index.",8);
          *(undefined8 *)local_130._0_8_ = 0x2064696c61766e49;
          *(undefined8 *)(local_130._0_8_ + 8) = 0x706564206b616577;
          local_130._8_8_ = local_1b0._0_8_;
          *(char *)(local_130._0_8_ + local_1b0._0_8_) = '\0';
          AddError(this,psVar13,&proto->super_Message,OTHER,(string *)local_130);
          if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
            operator_delete((void *)local_130._0_8_,(ulong)(local_130._16_8_ + 1));
          }
        }
        else {
          lVar24 = (long)iVar7;
          iVar7 = iVar7 + 1;
          *(int *)(*(long *)((long)local_1b8 + 0x40) + lVar24 * 4) = iVar22;
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 < (proto->weak_dependency_).current_size_);
    }
    pTVar21 = local_1b8;
    *(int *)((long)local_1b8 + 0x38) = iVar7;
    iVar7 = (proto->message_type_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)((long)local_1b8 + 0x48) = iVar7;
    pvVar14 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar7 * 0x78);
    *(void **)((long)pTVar21 + 0x50) = pvVar14;
    if (0 < (proto->message_type_).super_RepeatedPtrFieldBase.current_size_) {
      lVar23 = 0;
      lVar24 = 0;
      do {
        BuildMessage(this,(DescriptorProto *)
                          (proto->message_type_).super_RepeatedPtrFieldBase.elements_[lVar24],
                     (Descriptor *)0x0,(Descriptor *)(*(long *)((long)pTVar21 + 0x50) + lVar23));
        lVar24 = lVar24 + 1;
        lVar23 = lVar23 + 0x78;
      } while (lVar24 < (proto->message_type_).super_RepeatedPtrFieldBase.current_size_);
    }
    iVar7 = (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)((long)pTVar21 + 0x58) = iVar7;
    pvVar14 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar7 * 0x38);
    *(void **)((long)pTVar21 + 0x60) = pvVar14;
    if (0 < (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_) {
      lVar23 = 0;
      lVar24 = 0;
      do {
        BuildEnum(this,(EnumDescriptorProto *)
                       (proto->enum_type_).super_RepeatedPtrFieldBase.elements_[lVar24],
                  (Descriptor *)0x0,(EnumDescriptor *)(*(long *)((long)pTVar21 + 0x60) + lVar23));
        lVar24 = lVar24 + 1;
        lVar23 = lVar23 + 0x38;
      } while (lVar24 < (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_);
    }
    iVar7 = (proto->service_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)((long)pTVar21 + 0x68) = iVar7;
    pvVar14 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar7 * 0x30);
    *(void **)((long)pTVar21 + 0x70) = pvVar14;
    if (0 < (proto->service_).super_RepeatedPtrFieldBase.current_size_) {
      lVar23 = 0;
      lVar24 = 0;
      pvVar14 = extraout_RDX;
      do {
        BuildService(this,(ServiceDescriptorProto *)
                          (proto->service_).super_RepeatedPtrFieldBase.elements_[lVar24],pvVar14,
                     (ServiceDescriptor *)(*(long *)((long)pTVar21 + 0x70) + lVar23));
        lVar24 = lVar24 + 1;
        lVar23 = lVar23 + 0x30;
        pvVar14 = extraout_RDX_00;
      } while (lVar24 < (proto->service_).super_RepeatedPtrFieldBase.current_size_);
    }
    iVar7 = (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)((long)pTVar21 + 0x78) = iVar7;
    pvVar14 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar7 * 0x78);
    *(void **)((long)pTVar21 + 0x80) = pvVar14;
    if (0 < (proto->extension_).super_RepeatedPtrFieldBase.current_size_) {
      lVar23 = 0;
      lVar24 = 0;
      do {
        BuildFieldOrExtension
                  (this,(FieldDescriptorProto *)
                        (proto->extension_).super_RepeatedPtrFieldBase.elements_[lVar24],
                   (Descriptor *)0x0,(FieldDescriptor *)(*(long *)((long)pTVar21 + 0x80) + lVar23),
                   true);
        lVar24 = lVar24 + 1;
        lVar23 = lVar23 + 0x78;
      } while (lVar24 < (proto->extension_).super_RepeatedPtrFieldBase.current_size_);
    }
    if ((proto->_has_bits_[0] & 0x200) == 0) {
      *(undefined8 *)((long)pTVar21 + 0x88) = 0;
    }
    else {
      orig_options = proto->options_;
      if (orig_options == (FileOptions *)0x0) {
        orig_options = *(FileOptions **)(FileDescriptorProto::default_instance_ + 0xb8);
      }
      AllocateOptions(this,orig_options,(FileDescriptor *)pTVar21);
    }
    CrossLinkFile(this,(FileDescriptor *)pTVar21,proto);
    bVar6 = this->had_errors_;
    if ((bool)bVar6 == false) {
      OptionInterpreter::OptionInterpreter((OptionInterpreter *)local_130,this);
      pOVar17 = (this->options_to_interpret_).
                super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pOVar17 !=
          (this->options_to_interpret_).
          super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          pMVar3 = pOVar17->original_options;
          this_00 = &pOVar17->options->super_MessageLite;
          local_138 = pOVar17;
          local_130._8_8_ = pOVar17;
          iVar7 = (*this_00->_vptr_MessageLite[0x13])(this_00);
          local_178._M_dataplus._M_p = (pointer)0x14;
          local_1b0._0_8_ = &local_1a0;
          local_1b0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1b0,(ulong)&local_178);
          local_1a0._M_dataplus._M_p = local_178._M_dataplus._M_p;
          (((string *)local_1b0._0_8_)->_M_dataplus)._M_p = (pointer)0x707265746e696e75;
          ((string *)local_1b0._0_8_)->_M_string_length = 0x706f5f6465746572;
          *(undefined4 *)&((string *)local_1b0._0_8_)->field_2 = 0x6e6f6974;
          local_1b0._8_8_ = local_178._M_dataplus._M_p;
          *((long)&(((string *)local_1b0._0_8_)->_M_dataplus)._M_p + local_178._M_dataplus._M_p) =
               '\0';
          pFVar18 = Descriptor::FindFieldByName
                              ((Descriptor *)CONCAT44(extraout_var,iVar7),(string *)local_1b0);
          if ((string *)local_1b0._0_8_ != &local_1a0) {
            operator_delete((void *)local_1b0._0_8_,(long)local_1a0._M_dataplus._M_p + 1);
          }
          if (pFVar18 == (FieldDescriptor *)0x0) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_1b0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
                       ,0x10aa);
            pLVar9 = internal::LogMessage::operator<<
                               ((LogMessage *)local_1b0,
                                "CHECK failed: uninterpreted_options_field != NULL: ");
            pLVar9 = internal::LogMessage::operator<<
                               (pLVar9,
                                "No field named \"uninterpreted_option\" in the Options proto.");
            internal::LogFinisher::operator=((LogFinisher *)&local_178,pLVar9);
            internal::LogMessage::~LogMessage((LogMessage *)local_1b0);
          }
          iVar7 = (*this_00->_vptr_MessageLite[0x12])(this_00);
          (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar7) + 0x38))
                    ((long *)CONCAT44(extraout_var_00,iVar7),this_00,pFVar18);
          iVar7 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[0x13])(pMVar3);
          local_178._M_dataplus._M_p = (pointer)0x14;
          local_1b0._0_8_ = &local_1a0;
          local_1b0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1b0,(ulong)&local_178);
          local_1a0._M_dataplus._M_p = local_178._M_dataplus._M_p;
          (((string *)local_1b0._0_8_)->_M_dataplus)._M_p = (pointer)0x707265746e696e75;
          ((string *)local_1b0._0_8_)->_M_string_length = 0x706f5f6465746572;
          *(undefined4 *)&((string *)local_1b0._0_8_)->field_2 = 0x6e6f6974;
          local_1b0._8_8_ = local_178._M_dataplus._M_p;
          *((long)&(((string *)local_1b0._0_8_)->_M_dataplus)._M_p + local_178._M_dataplus._M_p) =
               '\0';
          pFVar18 = Descriptor::FindFieldByName
                              ((Descriptor *)CONCAT44(extraout_var_01,iVar7),(string *)local_1b0);
          if ((string *)local_1b0._0_8_ != &local_1a0) {
            operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0._M_dataplus._M_p + 1));
          }
          if (pFVar18 == (FieldDescriptor *)0x0) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_1b0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
                       ,0x10b2);
            pLVar9 = internal::LogMessage::operator<<
                               ((LogMessage *)local_1b0,
                                "CHECK failed: original_uninterpreted_options_field != NULL: ");
            pLVar9 = internal::LogMessage::operator<<
                               (pLVar9,
                                "No field named \"uninterpreted_option\" in the Options proto.");
            internal::LogFinisher::operator=((LogFinisher *)&local_178,pLVar9);
            internal::LogMessage::~LogMessage((LogMessage *)local_1b0);
          }
          iVar7 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[0x12])(pMVar3);
          iVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar7) + 0x30))
                            ((long *)CONCAT44(extraout_var_02,iVar7),pMVar3,pFVar18);
          if (0 < iVar7) {
            iVar22 = 0;
            do {
              iVar8 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[0x12])(pMVar3);
              psVar13 = (string *)
                        (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar8) + 0x160))
                                  ((long *)CONCAT44(extraout_var_03,iVar8),pMVar3,pFVar18,iVar22);
              lVar23 = __dynamic_cast(psVar13,&Message::typeinfo,&UninterpretedOption::typeinfo,0);
              if (lVar23 == 0) {
                __assert_fail("f == NULL || dynamic_cast<To>(f) != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                              ,0x158,
                              "To google::protobuf::internal::down_cast(From *) [To = const google::protobuf::UninterpretedOption *, From = const google::protobuf::Message]"
                             );
              }
              local_130._16_8_ = psVar13;
              bVar28 = OptionInterpreter::InterpretSingleOption
                                 ((OptionInterpreter *)local_130,(Message *)this_00);
              if (!bVar28) {
                local_130._8_8_ = (string *)0x0;
                local_130._16_8_ = (string *)0x0;
                pOVar25 = local_138;
                pTVar21 = local_1b8;
                goto LAB_001d1fb7;
              }
              iVar22 = iVar22 + 1;
            } while (iVar7 != iVar22);
          }
          local_130._8_8_ = (string *)0x0;
          local_130._16_8_ = (string *)0x0;
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
          local_178._M_string_length = 0;
          local_178.field_2._M_allocated_capacity =
               local_178.field_2._M_allocated_capacity & 0xffffffffffffff00;
          MessageLite::AppendToString(this_00,&local_178);
          bVar28 = MessageLite::ParseFromString(this_00,&local_178);
          pOVar25 = local_138;
          pTVar21 = local_1b8;
          if (!bVar28) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_1b0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
                       ,0x10d0);
            pLVar9 = internal::LogMessage::operator<<
                               ((LogMessage *)local_1b0,
                                "CHECK failed: options->ParseFromString(buf): ");
            pLVar9 = internal::LogMessage::operator<<
                               (pLVar9,"Protocol message serialized itself in invalid fashion.");
            internal::LogFinisher::operator=((LogFinisher *)&local_158,pLVar9);
            internal::LogMessage::~LogMessage((LogMessage *)local_1b0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
          }
LAB_001d1fb7:
          pOVar17 = pOVar25 + 1;
        } while (pOVar17 !=
                 (this->options_to_interpret_).
                 super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
        pOVar4 = (this->options_to_interpret_).
                 super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pOVar17 != pOVar4) {
          paVar27 = &(pOVar4->element_name).field_2;
          do {
            plVar15 = (long *)(((string *)(paVar27 + -1))->_M_dataplus)._M_p;
            if (paVar27 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar15) {
              operator_delete(plVar15,paVar27->_M_allocated_capacity + 1);
            }
            if (paVar27 + -2 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)paVar27[-3]._M_allocated_capacity) {
              operator_delete((long *)paVar27[-3]._M_allocated_capacity,
                              paVar27[-2]._M_allocated_capacity + 1);
            }
            pOVar17 = (pointer)(paVar27 + -3);
            paVar27 = paVar27 + 5;
          } while (pOVar17 != pOVar25);
          (this->options_to_interpret_).
          super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
          ._M_impl.super__Vector_impl_data._M_finish = pOVar4;
        }
      }
      DynamicMessageFactory::~DynamicMessageFactory(local_118);
      bVar6 = this->had_errors_;
    }
    if ((bVar6 & 1) == 0) {
      ValidateFileOptions(this,(FileDescriptor *)pTVar21,proto);
      bVar6 = this->had_errors_;
    }
    if ((bVar6 & 1) == 0) {
      DescriptorPool::Tables::ClearLastCheckpoint(this->tables_);
    }
    else {
      DescriptorPool::Tables::RollbackToLastCheckpoint(this->tables_);
      pTVar21 = (Tables *)0x0;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_60);
  }
  else {
    psVar13 = proto->name_;
    local_1b0._0_8_ = (string *)0x2d;
    local_130._0_8_ = local_130 + 0x10;
    local_130._0_8_ = std::__cxx11::string::_M_create((ulong *)local_130,(ulong)local_1b0);
    local_130._16_8_ = local_1b0._0_8_;
    builtin_strncpy((char *)(local_130._0_8_ + 0x1d),"ady in t",8);
    builtin_strncpy((char *)(local_130._0_8_ + 0x25),"he pool.",8);
    *(undefined8 *)(local_130._0_8_ + 0x10) = 0x736920656d616e20;
    *(undefined8 *)(local_130._0_8_ + 0x18) = 0x79646165726c6120;
    *(undefined8 *)local_130._0_8_ = 0x7720656c69662041;
    *(undefined8 *)(local_130._0_8_ + 8) = 0x7369687420687469;
    local_130._8_8_ = local_1b0._0_8_;
    *(char *)(local_130._0_8_ + local_1b0._0_8_) = '\0';
    AddError(this,psVar13,&proto->super_Message,OTHER,(string *)local_130);
    if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
      operator_delete((void *)local_130._0_8_,(ulong)(local_130._16_8_ + 1));
    }
    DescriptorPool::Tables::RollbackToLastCheckpoint(this->tables_);
LAB_001d18fb:
    pTVar21 = (Tables *)0x0;
  }
  return (FileDescriptor *)pTVar21;
LAB_001d0d3f:
  uVar26 = uVar26 + 1;
  lVar24 = lVar24 + 0x20;
  if (lVar23 + (ulong)(lVar23 == 0) == uVar26) goto LAB_001d0d4b;
  goto LAB_001d0d18;
}

Assistant:

const FileDescriptor* DescriptorBuilder::BuildFile(
    const FileDescriptorProto& proto) {
  filename_ = proto.name();

  // Check if the file already exists and is identical to the one being built.
  // Note:  This only works if the input is canonical -- that is, it
  //   fully-qualifies all type names, has no UninterpretedOptions, etc.
  //   This is fine, because this idempotency "feature" really only exists to
  //   accomodate one hack in the proto1->proto2 migration layer.
  const FileDescriptor* existing_file = tables_->FindFile(filename_);
  if (existing_file != NULL) {
    // File already in pool.  Compare the existing one to the input.
    FileDescriptorProto existing_proto;
    existing_file->CopyTo(&existing_proto);
    if (existing_proto.SerializeAsString() == proto.SerializeAsString()) {
      // They're identical.  Return the existing descriptor.
      return existing_file;
    }

    // Not a match.  The error will be detected and handled later.
  }

  // Check to see if this file is already on the pending files list.
  // TODO(kenton):  Allow recursive imports?  It may not work with some
  //   (most?) programming languages.  E.g., in C++, a forward declaration
  //   of a type is not sufficient to allow it to be used even in a
  //   generated header file due to inlining.  This could perhaps be
  //   worked around using tricks involving inserting #include statements
  //   mid-file, but that's pretty ugly, and I'm pretty sure there are
  //   some languages out there that do not allow recursive dependencies
  //   at all.
  for (int i = 0; i < tables_->pending_files_.size(); i++) {
    if (tables_->pending_files_[i] == proto.name()) {
      string error_message("File recursively imports itself: ");
      for (; i < tables_->pending_files_.size(); i++) {
        error_message.append(tables_->pending_files_[i]);
        error_message.append(" -> ");
      }
      error_message.append(proto.name());

      AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
               error_message);
      return NULL;
    }
  }

  // If we have a fallback_database_, attempt to load all dependencies now,
  // before checkpointing tables_.  This avoids confusion with recursive
  // checkpoints.
  if (pool_->fallback_database_ != NULL) {
    tables_->pending_files_.push_back(proto.name());
    for (int i = 0; i < proto.dependency_size(); i++) {
      if (tables_->FindFile(proto.dependency(i)) == NULL &&
          (pool_->underlay_ == NULL ||
           pool_->underlay_->FindFileByName(proto.dependency(i)) == NULL)) {
        // We don't care what this returns since we'll find out below anyway.
        pool_->TryFindFileInFallbackDatabase(proto.dependency(i));
      }
    }
    tables_->pending_files_.pop_back();
  }

  // Checkpoint the tables so that we can roll back if something goes wrong.
  tables_->AddCheckpoint();

  FileDescriptor* result = tables_->Allocate<FileDescriptor>();
  file_ = result;

  if (proto.has_source_code_info()) {
    SourceCodeInfo *info = tables_->AllocateMessage<SourceCodeInfo>();
    info->CopyFrom(proto.source_code_info());
    result->source_code_info_ = info;
  } else {
    result->source_code_info_ = &SourceCodeInfo::default_instance();
  }

  file_tables_ = tables_->AllocateFileTables();
  file_->tables_ = file_tables_;

  if (!proto.has_name()) {
    AddError("", proto, DescriptorPool::ErrorCollector::OTHER,
             "Missing field: FileDescriptorProto.name.");
  }

  result->name_ = tables_->AllocateString(proto.name());
  if (proto.has_package()) {
    result->package_ = tables_->AllocateString(proto.package());
  } else {
    // We cannot rely on proto.package() returning a valid string if
    // proto.has_package() is false, because we might be running at static
    // initialization time, in which case default values have not yet been
    // initialized.
    result->package_ = tables_->AllocateString("");
  }
  result->pool_ = pool_;

  // Add to tables.
  if (!tables_->AddFile(result)) {
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "A file with this name is already in the pool.");
    // Bail out early so that if this is actually the exact same file, we
    // don't end up reporting that every single symbol is already defined.
    tables_->RollbackToLastCheckpoint();
    return NULL;
  }
  if (!result->package().empty()) {
    AddPackage(result->package(), proto, result);
  }

  // Make sure all dependencies are loaded.
  set<string> seen_dependencies;
  result->dependency_count_ = proto.dependency_size();
  result->dependencies_ =
    tables_->AllocateArray<const FileDescriptor*>(proto.dependency_size());
  for (int i = 0; i < proto.dependency_size(); i++) {
    if (!seen_dependencies.insert(proto.dependency(i)).second) {
      AddError(proto.name(), proto,
               DescriptorPool::ErrorCollector::OTHER,
               "Import \"" + proto.dependency(i) + "\" was listed twice.");
    }

    const FileDescriptor* dependency = tables_->FindFile(proto.dependency(i));
    if (dependency == NULL && pool_->underlay_ != NULL) {
      dependency = pool_->underlay_->FindFileByName(proto.dependency(i));
    }

    if (dependency == NULL) {
      if (pool_->allow_unknown_) {
        dependency = NewPlaceholderFile(proto.dependency(i));
      } else {
        string message;
        if (pool_->fallback_database_ == NULL) {
          message = "Import \"" + proto.dependency(i) +
                    "\" has not been loaded.";
        } else {
          message = "Import \"" + proto.dependency(i) +
                    "\" was not found or had errors.";
        }
        AddError(proto.name(), proto,
                 DescriptorPool::ErrorCollector::OTHER,
                 message);
      }
    }

    result->dependencies_[i] = dependency;
  }

  // Check public dependencies.
  int public_dependency_count = 0;
  result->public_dependencies_ = tables_->AllocateArray<int>(
      proto.public_dependency_size());
  for (int i = 0; i < proto.public_dependency_size(); i++) {
    // Only put valid public dependency indexes.
    int index = proto.public_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->public_dependencies_[public_dependency_count++] = index;
    } else {
      AddError(proto.name(), proto,
               DescriptorPool::ErrorCollector::OTHER,
               "Invalid public dependency index.");
    }
  }
  result->public_dependency_count_ = public_dependency_count;

  // Build dependency set
  dependencies_.clear();
  for (int i = 0; i < result->dependency_count(); i++) {
    RecordPublicDependencies(result->dependency(i));
  }

  // Check weak dependencies.
  int weak_dependency_count = 0;
  result->weak_dependencies_ = tables_->AllocateArray<int>(
      proto.weak_dependency_size());
  for (int i = 0; i < proto.weak_dependency_size(); i++) {
    int index = proto.weak_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->weak_dependencies_[weak_dependency_count++] = index;
    } else {
      AddError(proto.name(), proto,
               DescriptorPool::ErrorCollector::OTHER,
               "Invalid weak dependency index.");
    }
  }
  result->weak_dependency_count_ = weak_dependency_count;

  // Convert children.
  BUILD_ARRAY(proto, result, message_type, BuildMessage  , NULL);
  BUILD_ARRAY(proto, result, enum_type   , BuildEnum     , NULL);
  BUILD_ARRAY(proto, result, service     , BuildService  , NULL);
  BUILD_ARRAY(proto, result, extension   , BuildExtension, NULL);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  // Note that the following steps must occur in exactly the specified order.

  // Cross-link.
  CrossLinkFile(result, proto);

  // Interpret any remaining uninterpreted options gathered into
  // options_to_interpret_ during descriptor building.  Cross-linking has made
  // extension options known, so all interpretations should now succeed.
  if (!had_errors_) {
    OptionInterpreter option_interpreter(this);
    for (vector<OptionsToInterpret>::iterator iter =
             options_to_interpret_.begin();
         iter != options_to_interpret_.end(); ++iter) {
      option_interpreter.InterpretOptions(&(*iter));
    }
    options_to_interpret_.clear();
  }

  // Validate options.
  if (!had_errors_) {
    ValidateFileOptions(result, proto);
  }

  if (had_errors_) {
    tables_->RollbackToLastCheckpoint();
    return NULL;
  } else {
    tables_->ClearLastCheckpoint();
    return result;
  }
}